

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

void stb_arith_decode_advance_log2(stb_arith *a,uint totalfreq2,uint freq,uint cumfreq)

{
  uint uVar1;
  
  uVar1 = a->range >> ((byte)totalfreq2 & 0x1f);
  a->code = a->code - cumfreq * uVar1;
  uVar1 = uVar1 * freq;
  a->range = uVar1;
  while (uVar1 < 0x1000000) {
    stb__renorm_decoder(a);
    uVar1 = a->range;
  }
  return;
}

Assistant:

void stb_arith_decode_advance_log2(stb_arith *a, unsigned int totalfreq2, unsigned int freq, unsigned int cumfreq)
{
   unsigned int freqsize = a->range >> totalfreq2;
   a->code -= freqsize * cumfreq;
   a->range = freqsize * freq;
   while (a->range < 0x1000000)
      stb__renorm_decoder(a);
}